

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void test_C2S_UDP_DATA(void)

{
  ulong uVar1;
  uint len;
  uint uVar2;
  int iVar3;
  uchar *buf;
  ulong uVar4;
  PipeMsg msg;
  PipeMsg newmsg;
  PipeMsg local_260;
  PipeMsg local_140;
  
  buf = (uchar *)operator_new__(0x40000);
  MsgHelper::initMsg(&local_260,C2S_UDP_DATA);
  local_260.field_1.common_tcp_data.METHOD = '\x02';
  local_260.field_1.common_tcp_data.LEN = 5;
  local_260.field_1.common_tcp_data.DATA = (uint8_t *)malloc(5);
  local_260.field_1.common_udp_data.ADDR.PORT = 0xffff;
  local_260.field_1.c2s_request.ADDR.ADDR[10] = '\x03';
  local_260.field_1._20_6_ = 0x61622e777777;
  local_260.field_1._26_2_ = 0x6469;
  local_260.field_1._28_6_ = 0x6d6f632e75;
  uVar4 = 0;
  do {
    uVar1 = uVar4 + 1;
    *(uint8_t *)((long)local_260.field_1.common_tcp_data.DATA + uVar4) = (uint8_t)uVar1;
    uVar4 = uVar1;
  } while (uVar1 < local_260.field_1.common_tcp_data.LEN);
  len = MsgHelper::serializeMsg(&local_260,buf);
  printHex(buf,len);
  uVar2 = MsgHelper::deserializeMsg(buf,0x40000,&local_140);
  printf("len = %d, newlen = %d\n",(ulong)len,(ulong)uVar2);
  if (uVar2 == len) {
    iVar3 = bcmp(local_260.field_1.common_tcp_data.DATA,local_140.field_1.common_tcp_data.DATA,
                 (ulong)local_260.field_1.common_tcp_data.LEN);
    if (iVar3 == 0) {
      MsgHelper::printMsg(&local_260);
      MsgHelper::printMsg(&local_140);
      MsgHelper::destroyMsg(&local_260);
      MsgHelper::destroyMsg(&local_140);
      operator_delete__(buf);
      return;
    }
    __assert_fail("memcmp(msg.common_udp_data.DATA, newmsg.common_udp_data.DATA, msg.common_udp_data.LEN) == 0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x13d,"void test_C2S_UDP_DATA()");
  }
  __assert_fail("newlen == len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                ,0x13b,"void test_C2S_UDP_DATA()");
}

Assistant:

void test_C2S_UDP_DATA()
{
	// LEN = size(MSG)
	// +---------+--------+------+------+----------+----------+----------+
	// | MSGTYPE | METHOD | LEN  | ATYP | DST.ADDR | DST.PORT |   DATA   |
	// +---------+--------+------+------+----------+----------+----------+
	// |   1     |   1    |  4   |  1   | Variable |    2     | Variable |
	// +---------+--------+------+------+----------+----------+----------+
	uint8_t *buf = new uint8_t[MSG_MAX_SIZE];
	PipeMsg msg;
	MsgHelper::initMsg(&msg, PIPEMSG_TYPE::C2S_UDP_DATA);
	msg.common_udp_data.METHOD = 2;
	msg.common_udp_data.LEN = 5;
	msg.common_udp_data.DATA = (uint8_t*)fc_malloc(msg.common_tcp_data.LEN);
	
	// SOKS5_ATYP_IPV4
	// SOKS5_ATYP_DOMAIN
	// SOKS5_ATYP_IPV6
	msg.common_udp_data.ADDR.PORT = 65535;
	msg.common_udp_data.ADDR.ATYP = SOKS5_ATYP_DOMAIN;
	
	if(msg.common_udp_data.ADDR.ATYP == SOKS5_ATYP_IPV4)
	{
		strcpy(msg.common_udp_data.ADDR.ADDR, "47.75.218.200");
	}
	else if(msg.common_udp_data.ADDR.ATYP == SOKS5_ATYP_IPV6)
	{
		// fe80:0000:0000:0000:0000:0000:0001:0000  fe80::0001:0000
		strcpy(msg.common_udp_data.ADDR.ADDR, "fe80::0001:0000");
	}
	else if(msg.common_udp_data.ADDR.ATYP == SOKS5_ATYP_DOMAIN)
	{
		strcpy(msg.common_udp_data.ADDR.ADDR, "www.baidu.com");
	}
	
	for(auto i = 0; i < msg.common_udp_data.LEN; ++i)
		msg.common_udp_data.DATA[i] = i + 1;
	
	uint32_t len = MsgHelper::serializeMsg(&msg, buf);
	printHex(buf, len);
	
	PipeMsg newmsg;
	uint32_t newlen = MsgHelper::deserializeMsg(buf, MSG_MAX_SIZE, &newmsg);

	printf("len = %d, newlen = %d\n", len, newlen);
	assert(newlen == len);
	
	assert(memcmp(msg.common_udp_data.DATA, newmsg.common_udp_data.DATA, msg.common_udp_data.LEN) == 0);
	
	MsgHelper::printMsg(&msg);
	MsgHelper::printMsg(&newmsg);	
	MsgHelper::destroyMsg(&msg);
	MsgHelper::destroyMsg(&newmsg);
	
	delete[]buf;
}